

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

bool __thiscall tonk::OutgoingQueue::PopIsEmpty(OutgoingQueue *this)

{
  OutgoingQueuedDatagram *pOVar1;
  bool bVar2;
  OutgoingQueuedDatagram *datagram;
  OutgoingQueue *this_local;
  
  pOVar1 = this->OldestQueued;
  this->OldestQueued = pOVar1->Next;
  this->QueuedBytes = this->QueuedBytes - pOVar1->NextWriteOffset;
  bVar2 = this->OldestQueued == (OutgoingQueuedDatagram *)0x0;
  if (bVar2) {
    this->NewestQueued = (OutgoingQueuedDatagram *)0x0;
  }
  return bVar2;
}

Assistant:

bool OutgoingQueue::PopIsEmpty()
{
    OutgoingQueuedDatagram* datagram = OldestQueued;
    TONK_DEBUG_ASSERT(datagram != nullptr);

    // Advance the list head
    OldestQueued = datagram->Next;

    // Update queued bytes
    TONK_DEBUG_ASSERT(QueuedBytes >= datagram->NextWriteOffset);
    QueuedBytes -= datagram->NextWriteOffset;

    // If this was the end of the list:
    if (!OldestQueued)
    {
        NewestQueued = nullptr;
        return true;
    }

    return false;
}